

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O2

void __thiscall
enact::VariableTypename::VariableTypename(VariableTypename *this,VariableTypename *typename_)

{
  undefined1 local_40 [48];
  
  Token::Token((Token *)local_40,&typename_->m_identifier);
  VariableTypename(this,(Token *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return;
}

Assistant:

VariableTypename::VariableTypename(const VariableTypename &typename_) :
            VariableTypename{typename_.m_identifier} {
    }